

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall pg::Game::parse_solution(Game *this,istream *in)

{
  ulong *puVar1;
  uint64_t *puVar2;
  char *__nptr;
  Game *pGVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  int *piVar7;
  ulong uVar8;
  long *plVar9;
  runtime_error *prVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int w;
  int str;
  string token;
  string line;
  stringstream ss;
  undefined8 local_210;
  int local_204;
  char *local_200;
  undefined8 local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  Game *local_1c0;
  undefined1 local_1b8 [392];
  
  local_1e0 = &local_1d0;
  local_1d8 = 0;
  local_1d0 = 0;
  local_1c0 = this;
  while( true ) {
    cVar4 = std::ios::widen((char)in->_vptr_basic_istream[-3] + (char)in);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (in,(string *)&local_1e0,cVar4);
    if (((&piVar6->field_0x20)[(long)piVar6->_vptr_basic_istream[-3]] & 5) != 0) {
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
      }
      return;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)&local_1e0,_S_out|_S_in);
    local_1f8 = 0;
    local_1f0 = '\0';
    local_200 = &local_1f0;
    piVar6 = std::operator>>((istream *)local_1b8,(string *)&local_200);
    if ((((&piVar6->field_0x20)[(long)piVar6->_vptr_basic_istream[-3]] & 5) == 0) &&
       (iVar5 = std::__cxx11::string::compare((char *)&local_200), __nptr = local_200, iVar5 != 0))
    break;
LAB_0013cf05:
    if (local_200 != &local_1f0) {
      operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  piVar7 = __errno_location();
  iVar5 = *piVar7;
  *piVar7 = 0;
  uVar8 = strtol(__nptr,(char **)&local_210,10);
  pGVar3 = local_1c0;
  if ((char *)CONCAT44(local_210._4_4_,(uint)local_210) == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_0013cfe3:
    std::__throw_out_of_range("stoi");
  }
  else {
    uVar13 = (uint)uVar8;
    if (((long)(int)uVar13 != uVar8) || (*piVar7 == 0x22)) goto LAB_0013cfe3;
    if (*piVar7 == 0) {
      *piVar7 = iVar5;
    }
    if ((int)uVar13 < 0) {
LAB_0013cf66:
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"node index out of bounds");
      goto LAB_0013d00b;
    }
    uVar12 = (ulong)(uVar13 & 0x7fffffff);
    if (local_1c0->n_vertices <= (long)uVar12) goto LAB_0013cf66;
    uVar13 = (uVar13 & 0x7fffffff) >> 6;
    if (((local_1c0->solved)._bits[uVar13] >> (uVar8 & 0x3f) & 1) == 0) {
      plVar9 = (long *)std::istream::operator>>((istream *)local_1b8,(int *)&local_210);
      if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"missing winner");
LAB_0013cfc1:
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (1 < (uint)local_210) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"invalid winner");
        goto LAB_0013cfc1;
      }
      uVar8 = 1L << (uVar8 & 0x3f);
      puVar1 = (pGVar3->solved)._bits + uVar13;
      *puVar1 = *puVar1 | uVar8;
      puVar2 = (pGVar3->winner)._bits;
      if ((uint)local_210 == 0) {
        uVar11 = ~uVar8 & puVar2[uVar13];
      }
      else {
        uVar11 = puVar2[uVar13] | uVar8;
      }
      *(ulong *)((long)puVar2 + (ulong)(uVar13 << 3)) = uVar11;
      if ((uint)local_210 ==
          ((*(ulong *)((long)(pGVar3->_owner)._bits + (ulong)(uVar13 << 3)) & uVar8) != 0)) {
        plVar9 = (long *)std::istream::operator>>((istream *)local_1b8,&local_204);
        if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"missing strategy for winning node");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pGVar3->strategy[uVar12] = local_204;
      }
      else {
        pGVar3->strategy[uVar12] = -1;
      }
      goto LAB_0013cf05;
    }
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"node already solved");
LAB_0013d00b:
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Game::parse_solution(std::istream &in)
{
    string line;
    while (getline(in, line)) {
        stringstream ss(line);
        string token;

        // ignore empty line
        if (!(ss >> token)) continue;

        // ignore line with "paritysol"
        if (token == "paritysol") continue;

        // get node
        int ident = stoi(token);
        if (ident < 0 || ident >= n_vertices) {
            throw std::runtime_error("node index out of bounds");
        }

        if (solved[ident]) throw std::runtime_error("node already solved");

        // parse winner
        int w;
        if (!(ss >> w)) throw std::runtime_error("missing winner");
        if (w!= 0 && w!= 1) throw std::runtime_error("invalid winner");

        // set winner
        solved[ident] = true;
        winner[ident] = w;

        // parse strategy
        if (w == _owner[ident]) {
            int str;
            if (!(ss >> str)) throw std::runtime_error("missing strategy for winning node");
            // if (!has_edge(ident, str)) throw std::runtime_error("strategy not successor of node");
            // actually this is already checked by the verifier
            strategy[ident] = str;
        } else {
            strategy[ident] = -1;
        }
    }
}